

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

void __thiscall
kratos::ConditionalExpr::ConditionalExpr
          (ConditionalExpr *this,shared_ptr<kratos::Var> *condition,shared_ptr<kratos::Var> *left,
          shared_ptr<kratos::Var> *right)

{
  element_type *peVar1;
  int iVar2;
  VarException *this_00;
  initializer_list<const_kratos::IRNode_*> __l;
  string local_70;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_50;
  element_type *local_38;
  allocator<char> local_2a;
  allocator_type local_29;
  
  Expr::Expr(&this->super_Expr,Conditional,
             (left->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
             (right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  (this->super_Expr).super_Var.super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_002b0e38;
  peVar1 = (condition->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this->condition = peVar1;
  iVar2 = (*(peVar1->super_IRNode)._vptr_IRNode[7])();
  if (iVar2 == 1) {
    return;
  }
  this_00 = (VarException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Ternary operator\'s condition has to be a binary value",&local_2a)
  ;
  local_38 = (condition->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_38;
  std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
            (&local_50,__l,&local_29);
  VarException::VarException(this_00,&local_70,&local_50);
  __cxa_throw(this_00,&VarException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ConditionalExpr::ConditionalExpr(const std::shared_ptr<Var> &condition,
                                 const std::shared_ptr<Var> &left,
                                 const std::shared_ptr<Var> &right)
    : Expr(ExprOp::Conditional, left.get(), right.get()), condition(condition.get()) {
    if (condition->width() != 1)
        throw VarException("Ternary operator's condition has to be a binary value",
                           {condition.get()});
}